

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::sortMaxDown
          (cbtAxisSweep3Internal<unsigned_int> *this,int axis,uint edge,cbtDispatcher *dispatcher,
          bool updateOverlaps)

{
  int *piVar1;
  uint *puVar2;
  cbtOverlappingPairCallback *pcVar3;
  Edge EVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  Handle *handle1;
  Handle *pHVar11;
  Handle *pHVar12;
  Edge *pEVar13;
  
  lVar8 = (long)axis;
  uVar6 = (ulong)edge;
  pEVar13 = this->m_pEdges[lVar8];
  uVar5 = pEVar13[uVar6 - 1].m_pos;
  if (pEVar13[uVar6].m_pos < uVar5) {
    pEVar13 = pEVar13 + uVar6;
    uVar9 = 1 << (axis & 0x1fU) & 3;
    uVar10 = 1 << uVar9 & 3;
    puVar2 = this->m_pHandles[pEVar13->m_handle].m_maxEdges + lVar8;
    do {
      lVar7 = 0x40;
      pHVar11 = this->m_pHandles + pEVar13[-1].m_handle;
      if (((((uVar5 & 1) == 0) && (lVar7 = 0x34, updateOverlaps)) &&
          (pHVar12 = this->m_pHandles + pEVar13->m_handle,
          *(uint *)((long)(&(pHVar11->super_cbtBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar9 * 4))
          <= *(uint *)((long)pHVar12->m_maxEdges + (ulong)(uVar9 * 4)))) &&
         (((*(uint *)((long)(&(pHVar12->super_cbtBroadphaseProxy).m_aabbMax + 1) +
                     (ulong)(uVar9 * 4)) <=
            *(uint *)((long)pHVar11->m_maxEdges + (ulong)(uVar9 * 4)) &&
           (uVar6 = (ulong)(uVar10 * 4),
           *(uint *)((long)(&(pHVar11->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar6) <=
           *(uint *)((long)pHVar12->m_maxEdges + uVar6))) &&
          (uVar6 = (ulong)(uVar10 * 4),
          *(uint *)((long)(&(pHVar12->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar6) <=
          *(uint *)((long)pHVar11->m_maxEdges + uVar6))))) {
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[3])
                  (this->m_pairCache,pHVar12,pHVar11);
        pcVar3 = this->m_userPairCallback;
        if (pcVar3 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar3->_vptr_cbtOverlappingPairCallback[3])(pcVar3,pHVar12,pHVar11,dispatcher);
        }
      }
      piVar1 = (int *)((long)(pHVar11->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                      lVar8 * 4 + lVar7 + -0x14);
      *piVar1 = *piVar1 + 1;
      *puVar2 = *puVar2 - 1;
      EVar4 = *pEVar13;
      *pEVar13 = pEVar13[-1];
      pEVar13[-1] = EVar4;
      uVar5 = pEVar13[-2].m_pos;
      pEVar13 = pEVar13 + -1;
    } while (EVar4.m_pos < uVar5);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxDown(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* dispatcher, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (!pPrev->IsMax())
		{
			// if previous edge was a minimum remove any overlap between the two handles
			Handle* handle0 = getHandle(pEdge->m_handle);
			Handle* handle1 = getHandle(pPrev->m_handle);
			const int axis1 = (1 << axis) & 3;
			const int axis2 = (1 << axis1) & 3;

			if (updateOverlaps
#ifdef USE_OVERLAP_TEST_ON_REMOVES
				&& testOverlap2D(handle0, handle1, axis1, axis2)
#endif  //USE_OVERLAP_TEST_ON_REMOVES
			)
			{
				//this is done during the overlappingpairarray iteration/narrowphase collision

				m_pairCache->removeOverlappingPair(handle0, handle1, dispatcher);
				if (m_userPairCallback)
					m_userPairCallback->removeOverlappingPair(handle0, handle1, dispatcher);
			}

			// update edge reference in other handle
			pHandlePrev->m_minEdges[axis]++;
			;
		}
		else
			pHandlePrev->m_maxEdges[axis]++;

		pHandleEdge->m_maxEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}